

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O3

World * __thiscall
despot::PlannerBase::InitializeWorld
          (PlannerBase *this,string *world_type,DSPOMDP *model,Option *options)

{
  int iVar1;
  World *pWVar2;
  ostream *poVar3;
  string *this_00;
  
  this_00 = world_type;
  iVar1 = std::__cxx11::string::compare((char *)world_type);
  if (iVar1 == 0) {
    pWVar2 = InitializePOMDPWorld((PlannerBase *)this_00,world_type,model,options);
    return pWVar2;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "Unsupported world type (pomdp by default). To support custom world, implement "
                          );
  poVar3 = std::operator<<(poVar3,"InitializeWorld");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

World* PlannerBase::InitializeWorld(std::string& world_type, DSPOMDP* model,
		option::Option* options) {
	if (world_type == "pomdp")
		return InitializePOMDPWorld(world_type, model, options);
	else {
		cerr
				<< "Unsupported world type (pomdp by default). To support custom world, implement "
				<< __FUNCTION__ << endl;
		exit(-1);
	}
}